

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall SPSUnit::hrd_parameters(SPSUnit *this,HRDParams *params)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  reference pvVar5;
  ulong local_28;
  size_t SchedSelIdx;
  HRDParams *params_local;
  SPSUnit *this_local;
  
  uVar3 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
  params->cpb_cnt_minus1 = uVar3;
  if (params->cpb_cnt_minus1 < 0x20) {
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,4);
    params->bit_rate_scale = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,4);
    params->cpb_size_scale = uVar1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->bit_rate_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->cpb_size_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&params->cbr_flag,(ulong)(params->cpb_cnt_minus1 + 1));
    for (local_28 = 0; local_28 <= params->cpb_cnt_minus1; local_28 = local_28 + 1) {
      uVar3 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&params->bit_rate_value_minus1,local_28);
      *pvVar4 = uVar3;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&params->bit_rate_value_minus1,local_28);
      if (*pvVar4 == 0xffffffff) {
        return 1;
      }
      uVar3 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&params->cpb_size_value_minus1,local_28);
      *pvVar4 = uVar3;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&params->cpb_size_value_minus1,local_28);
      if (*pvVar4 == 0xffffffff) {
        return 1;
      }
      bVar2 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&params->cbr_flag,local_28);
      *pvVar5 = bVar2;
    }
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,5);
    params->initial_cpb_removal_delay_length_minus1 = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,5);
    params->cpb_removal_delay_length_minus1 = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,5);
    params->dpb_output_delay_length_minus1 = uVar1;
    uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,5);
    params->time_offset_length = uVar1;
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int SPSUnit::hrd_parameters(HRDParams& params)
{
    params.cpb_cnt_minus1 = extractUEGolombCode();
    if (params.cpb_cnt_minus1 >= 32)
        return 1;
    params.bit_rate_scale = bitReader.getBits<uint8_t>(4);
    params.cpb_size_scale = bitReader.getBits<uint8_t>(4);

    params.bit_rate_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cpb_size_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cbr_flag.resize(params.cpb_cnt_minus1 + 1);

    for (size_t SchedSelIdx = 0; SchedSelIdx <= params.cpb_cnt_minus1; SchedSelIdx++)
    {
        params.bit_rate_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.bit_rate_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cpb_size_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.cpb_size_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cbr_flag[SchedSelIdx] = bitReader.getBit();
    }
    params.initial_cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.dpb_output_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.time_offset_length = bitReader.getBits<uint8_t>(5);

    return 0;
}